

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

string * __thiscall
bsim::quad_value_bit_vector::binary_string_abi_cxx11_
          (string *__return_storage_ptr__,quad_value_bit_vector *this)

{
  long lVar1;
  quad_value local_59;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (0 < (long)this->N) {
    lVar1 = (long)this->N + 1;
    do {
      local_59.value =
           (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar1 + -2].value;
      quad_value::binary_string_abi_cxx11_(&local_50,&local_59);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string binary_string() const {
      std::string str = "";
      const int N = bitLength();
      for (int i = N - 1; i >= 0; i--) {
        str += get(i).binary_string();
      }

      return str;
    }